

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1chord_angle.cc
# Opt level: O3

double sin2(S1ChordAngle a)

{
  double dVar1;
  S2LogMessage SStack_18;
  
  dVar1 = ABS(a.length2_);
  if ((0x3fe < (uint)((long)dVar1 + 0xfff0000000000000U >> 0x35) || -1 < (long)a.length2_) &&
      (dVar1 != INFINITY && (0xffffffffffffe < (long)dVar1 - 1U || -1 < (long)a.length2_))) {
    return (a.length2_ * -0.25 + 1.0) * a.length2_;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.cc"
             ,0x86,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: !a.is_special() ",0x1e);
  abort();
}

Assistant:

double sin2(S1ChordAngle a) {
  S2_DCHECK(!a.is_special());
  // Let "a" be the (non-squared) chord length, and let A be the corresponding
  // half-angle (a = 2*sin(A)).  The formula below can be derived from:
  //   sin(2*A) = 2 * sin(A) * cos(A)
  //   cos^2(A) = 1 - sin^2(A)
  // This is much faster than converting to an angle and computing its sine.
  return a.length2() * (1 - 0.25 * a.length2());
}